

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O2

size_t __thiscall
frozen::unordered_map<int,_int,_128UL,_frozen::elsa<int>,_std::equal_to<int>_>::count<int>
          (unordered_map<int,_int,_128UL,_frozen::elsa<int>,_std::equal_to<int>_> *this,int *key)

{
  const_iterator pvVar1;
  
  pvVar1 = find<int>(this,key);
  return (ulong)((tables_type *)pvVar1 != &this->tables_);
}

Assistant:

constexpr std::size_t count(KeyType const &key) const {
    return find(key) != end();
  }